

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineOrder.cpp
# Opt level: O3

void testLineOrder(string *tempDir)

{
  pointer pcVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [11];
  undefined1 auVar21 [13];
  undefined1 auVar22 [14];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined3 uVar25;
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined5 uVar28;
  undefined1 auVar29 [12];
  undefined8 uVar30;
  undefined1 auVar31 [14];
  uint6 uVar32;
  _Alloc_hider __filename;
  byte bVar33;
  int y;
  int iVar34;
  int iVar35;
  char *pcVar36;
  ulong uVar37;
  long *plVar38;
  ostream *poVar39;
  int *piVar40;
  void *pvVar41;
  undefined8 *puVar42;
  undefined8 *puVar43;
  float *pfVar44;
  float *pfVar45;
  _Rb_tree_node_base *p_Var46;
  _Rb_tree_node_base *p_Var47;
  _Rb_tree_node_base *p_Var48;
  undefined8 uVar49;
  char *pcVar50;
  long lVar51;
  void *pvVar52;
  ulong uVar53;
  ulong uVar54;
  int iVar55;
  int iVar56;
  bool bVar57;
  bool bVar58;
  ushort uVar59;
  ushort uVar67;
  float fVar60;
  ushort uVar68;
  ushort uVar70;
  char cVar71;
  float fVar69;
  byte bVar74;
  ushort uVar72;
  byte bVar78;
  ushort uVar76;
  ushort uVar77;
  float fVar73;
  byte bVar75;
  byte bVar79;
  byte bVar84;
  ushort uVar80;
  byte bVar85;
  undefined1 auVar61 [16];
  ushort uVar81;
  byte bVar88;
  ushort uVar86;
  ushort uVar87;
  float fVar82;
  uint uVar83;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  byte bVar89;
  byte bVar90;
  char cVar104;
  ushort uVar91;
  char cVar105;
  char cVar109;
  ushort uVar107;
  ushort uVar108;
  undefined4 uVar92;
  char cVar110;
  char cVar114;
  ushort uVar112;
  ushort uVar113;
  char cVar115;
  char cVar119;
  ushort uVar117;
  ushort uVar118;
  byte bVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  ushort uVar125;
  ushort uVar126;
  ushort uVar127;
  ushort uVar128;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  byte bVar106;
  byte bVar111;
  byte bVar116;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  uint uVar140;
  uint uVar144;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  uint uVar145;
  undefined1 auVar146 [16];
  long lVar150;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  uint uVar156;
  uint uVar161;
  uint uVar162;
  uint uVar163;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  uint uVar168;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  uint uVar169;
  uint uVar173;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  uint uVar174;
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  uint uVar177;
  uint uVar179;
  uint uVar180;
  uint uVar181;
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  uint uVar186;
  undefined1 auVar185 [16];
  float fVar187;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  uint uVar197;
  undefined1 in_XMM14 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  string filename;
  FrameBuffer fb;
  long local_188;
  long lStack_180;
  long local_178;
  long lStack_170;
  Header hdr;
  long local_e8;
  long lStack_e0;
  long local_d8;
  long lStack_d0;
  InputFile in;
  OutputFile out;
  undefined6 uVar93;
  undefined1 auVar94 [12];
  undefined1 auVar95 [14];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing line order and random access to scan lines",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  pcVar36 = (char *)operator_new__(0x58aa);
  uVar37 = 0;
  pcVar50 = pcVar36;
  do {
    iVar34 = ((int)uVar37 + (int)((uVar37 & 0xffffffff) / 0x11) * -0x11) * 10;
    lVar51 = 7;
    auVar170 = ZEXT816(0x706050403020100);
    auVar103 = _DAT_001bcae0;
    auVar155 = _DAT_001c0cb0;
    auVar160 = _DAT_001c0ce0;
    auVar167 = _DAT_001c0cd0;
    do {
      auVar61 = auVar103 ^ _DAT_001bcaf0;
      auVar130._0_4_ = -(uint)(auVar61._0_4_ < -0x7fffff8b);
      auVar130._4_4_ = -(uint)(auVar61._0_4_ < -0x7fffff8b);
      auVar130._8_4_ = -(uint)(auVar61._8_4_ < -0x7fffff8b);
      auVar130._12_4_ = -(uint)(auVar61._8_4_ < -0x7fffff8b);
      auVar198._0_4_ = -(uint)(auVar61._4_4_ == -0x80000000);
      auVar198._4_4_ = -(uint)(auVar61._4_4_ == -0x80000000);
      auVar198._8_4_ = -(uint)(auVar61._12_4_ == -0x80000000);
      auVar198._12_4_ = -(uint)(auVar61._12_4_ == -0x80000000);
      auVar61 = auVar155 ^ _DAT_001bcaf0;
      auVar131._0_4_ = -(uint)(auVar61._0_4_ < -0x7fffff8b);
      auVar131._4_4_ = -(uint)(auVar61._0_4_ < -0x7fffff8b);
      auVar131._8_4_ = -(uint)(auVar61._8_4_ < -0x7fffff8b);
      auVar131._12_4_ = -(uint)(auVar61._8_4_ < -0x7fffff8b);
      auVar199._0_4_ = -(uint)(auVar61._4_4_ == -0x80000000);
      auVar199._4_4_ = -(uint)(auVar61._4_4_ == -0x80000000);
      auVar199._8_4_ = -(uint)(auVar61._12_4_ == -0x80000000);
      auVar199._12_4_ = -(uint)(auVar61._12_4_ == -0x80000000);
      auVar199 = packssdw(auVar198 & auVar130,auVar199 & auVar131);
      auVar61 = auVar160 ^ _DAT_001bcaf0;
      auVar132._0_4_ = -(uint)(auVar61._0_4_ < -0x7fffff8b);
      auVar132._4_4_ = -(uint)(auVar61._0_4_ < -0x7fffff8b);
      auVar132._8_4_ = -(uint)(auVar61._8_4_ < -0x7fffff8b);
      auVar132._12_4_ = -(uint)(auVar61._8_4_ < -0x7fffff8b);
      auVar195._0_4_ = -(uint)(auVar61._4_4_ == -0x80000000);
      auVar195._4_4_ = -(uint)(auVar61._4_4_ == -0x80000000);
      auVar195._8_4_ = -(uint)(auVar61._12_4_ == -0x80000000);
      auVar195._12_4_ = -(uint)(auVar61._12_4_ == -0x80000000);
      auVar61 = auVar167 ^ _DAT_001bcaf0;
      auVar141._0_4_ = -(uint)(auVar61._0_4_ < -0x7fffff8b);
      auVar141._4_4_ = -(uint)(auVar61._0_4_ < -0x7fffff8b);
      auVar141._8_4_ = -(uint)(auVar61._8_4_ < -0x7fffff8b);
      auVar141._12_4_ = -(uint)(auVar61._8_4_ < -0x7fffff8b);
      auVar101._0_4_ = -(uint)(auVar61._4_4_ == -0x80000000);
      auVar101._4_4_ = -(uint)(auVar61._4_4_ == -0x80000000);
      auVar101._8_4_ = -(uint)(auVar61._12_4_ == -0x80000000);
      auVar101._12_4_ = -(uint)(auVar61._12_4_ == -0x80000000);
      auVar61 = packssdw(auVar195 & auVar132,auVar101 & auVar141);
      auVar200 = packssdw(auVar199,auVar61);
      bVar33 = auVar170[8];
      bVar74 = auVar170[9];
      bVar75 = auVar170[10];
      bVar78 = auVar170[0xb];
      bVar79 = auVar170[0xc];
      bVar84 = auVar170[0xd];
      bVar85 = auVar170[0xe];
      bVar88 = auVar170[0xf];
      uVar76 = (ushort)bVar84 * 0xcd;
      uVar80 = (ushort)bVar85 * 0xcd;
      uVar86 = (ushort)bVar88 * 0xcd;
      uVar59 = (ushort)((ushort)bVar33 * 0xcd) >> 8;
      uVar67 = (ushort)((ushort)bVar74 * 0xcd) >> 8;
      uVar68 = (ushort)((ushort)bVar75 * 0xcd) >> 8;
      uVar70 = (ushort)((ushort)bVar78 * 0xcd) >> 8;
      uVar72 = (ushort)((ushort)bVar79 * 0xcd) >> 8;
      uVar77 = uVar76 >> 8;
      uVar81 = uVar80 >> 8;
      uVar87 = uVar86 >> 8;
      cVar119 = auVar170[7];
      auVar5[0xd] = 0;
      auVar5._0_13_ = auVar170._0_13_;
      auVar5[0xe] = cVar119;
      cVar115 = auVar170[6];
      auVar7[0xc] = cVar115;
      auVar7._0_12_ = auVar170._0_12_;
      auVar7._13_2_ = auVar5._13_2_;
      auVar9[0xb] = 0;
      auVar9._0_11_ = auVar170._0_11_;
      auVar9._12_3_ = auVar7._12_3_;
      cVar114 = auVar170[5];
      auVar10[10] = cVar114;
      auVar10._0_10_ = auVar170._0_10_;
      auVar10._11_4_ = auVar9._11_4_;
      auVar12[9] = 0;
      auVar12._0_9_ = auVar170._0_9_;
      auVar12._10_5_ = auVar10._10_5_;
      cVar110 = auVar170[4];
      auVar13[8] = cVar110;
      auVar13._0_8_ = auVar170._0_8_;
      auVar13._9_6_ = auVar12._9_6_;
      auVar15._7_8_ = 0;
      auVar15._0_7_ = auVar13._8_7_;
      cVar109 = auVar170[3];
      Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),cVar109);
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var16;
      cVar105 = auVar170[2];
      auVar17._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar17[0] = cVar105;
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar17;
      cVar104 = auVar170[1];
      auVar18._1_12_ = SUB1512(auVar24 << 0x20,3);
      auVar18[0] = cVar104;
      bVar89 = auVar170[0];
      uVar107 = auVar18._0_2_ * 0xcd;
      uVar112 = auVar17._0_2_ * 0xcd;
      uVar117 = (short)Var16 * 0xcd;
      uVar121 = auVar13._8_2_ * 0xcd;
      uVar123 = auVar10._10_2_ * 0xcd;
      uVar125 = auVar7._12_2_ * 0xcd;
      uVar127 = (auVar5._13_2_ >> 8) * 0xcd;
      uVar91 = (ushort)((ushort)bVar89 * 0xcd) >> 8;
      uVar108 = uVar107 >> 8;
      uVar113 = uVar112 >> 8;
      uVar118 = uVar117 >> 8;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar91 = CONCAT11((uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108)
                        ,(uVar91 != 0) * (uVar91 < 0x100) *
                         (char)((ushort)((ushort)bVar89 * 0xcd) >> 8) - (0xff < uVar91));
      uVar92 = CONCAT13((uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118)
                        ,CONCAT12((uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) -
                                  (0xff < uVar113),uVar91));
      uVar93 = CONCAT15((uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124)
                        ,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) -
                                  (0xff < uVar122),uVar92));
      uVar49 = CONCAT17((uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128)
                        ,CONCAT16((uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) -
                                  (0xff < uVar126),uVar93));
      auVar94._0_10_ =
           CONCAT19((uVar67 != 0) * (uVar67 < 0x100) * (char)((ushort)((ushort)bVar74 * 0xcd) >> 8)
                    - (0xff < uVar67),
                    CONCAT18((uVar59 != 0) * (uVar59 < 0x100) *
                             (char)((ushort)((ushort)bVar33 * 0xcd) >> 8) - (0xff < uVar59),uVar49))
      ;
      auVar94[10] = (uVar68 != 0) * (uVar68 < 0x100) * (char)((ushort)((ushort)bVar75 * 0xcd) >> 8)
                    - (0xff < uVar68);
      auVar94[0xb] = (uVar70 != 0) * (uVar70 < 0x100) * (char)((ushort)((ushort)bVar78 * 0xcd) >> 8)
                     - (0xff < uVar70);
      auVar95[0xc] = (uVar72 != 0) * (uVar72 < 0x100) * (char)((ushort)((ushort)bVar79 * 0xcd) >> 8)
                     - (0xff < uVar72);
      auVar95._0_12_ = auVar94;
      auVar95[0xd] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
      auVar176[0xe] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
      auVar176._0_14_ = auVar95;
      auVar176[0xf] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
      auVar96._0_2_ = uVar91 >> 3;
      auVar96._2_2_ = (ushort)((uint)uVar92 >> 0x13);
      auVar96._4_2_ = (ushort)((uint6)uVar93 >> 0x23);
      auVar96._6_2_ = (ushort)((ulong)uVar49 >> 0x33);
      auVar96._8_2_ = (ushort)((unkuint10)auVar94._0_10_ >> 0x43);
      auVar96._10_2_ = auVar94._10_2_ >> 3;
      auVar96._12_2_ = auVar95._12_2_ >> 3;
      auVar96._14_2_ = auVar176._14_2_ >> 3;
      auVar96 = auVar96 & _DAT_001c4a90;
      auVar202._0_14_ = auVar96._0_14_;
      auVar202[0xe] = auVar96[7];
      auVar202[0xf] = auVar96[7];
      auVar99._14_2_ = auVar202._14_2_;
      auVar99._0_13_ = auVar96._0_13_;
      auVar99[0xd] = auVar96[6];
      auVar98._13_3_ = auVar99._13_3_;
      auVar98._0_12_ = auVar96._0_12_;
      auVar98[0xc] = auVar96[6];
      auVar189._12_4_ = auVar98._12_4_;
      auVar189._0_11_ = auVar96._0_11_;
      auVar189[0xb] = auVar96[5];
      auVar97._11_5_ = auVar189._11_5_;
      auVar97._0_10_ = auVar96._0_10_;
      auVar97[10] = auVar96[5];
      bVar90 = auVar96[0] * '\n';
      bVar106 = auVar96[1] * '\n';
      bVar111 = auVar96[2] * '\n';
      bVar116 = auVar96[3] * '\n';
      bVar120 = auVar96[4] * '\n';
      uVar77 = auVar97._10_2_ * 10;
      uVar81 = auVar98._12_2_ * 10;
      uVar67 = (ushort)bVar90;
      uVar68 = (ushort)bVar106;
      uVar70 = (ushort)bVar111;
      uVar72 = (ushort)bVar116;
      uVar76 = (ushort)bVar120;
      uVar80 = uVar77 & 0xff;
      uVar86 = uVar81 & 0xff;
      uVar59 = auVar99._14_2_ * 10 & 0xff;
      cVar71 = cVar119 - ((uVar59 != 0) * (uVar59 < 0x100) * (char)(auVar99._14_2_ * 10) -
                         (0xff < uVar59));
      uVar59 = CONCAT11(bVar33 - ((uVar67 != 0) * (uVar67 < 0x100) * bVar90 - (0xff < uVar67)),
                        cVar71);
      uVar25 = CONCAT12(bVar74 - ((uVar68 != 0) * (uVar68 < 0x100) * bVar106 - (0xff < uVar68)),
                        uVar59);
      uVar83 = CONCAT13(bVar75 - ((uVar70 != 0) * (uVar70 < 0x100) * bVar111 - (0xff < uVar70)),
                        uVar25);
      uVar28 = CONCAT14(bVar78 - ((uVar72 != 0) * (uVar72 < 0x100) * bVar116 - (0xff < uVar72)),
                        uVar83);
      auVar31[5] = bVar79 - ((uVar76 != 0) * (uVar76 < 0x100) * bVar120 - (0xff < uVar76));
      auVar31._0_5_ = uVar28;
      auVar31._6_8_ = 0;
      auVar4[0xe] = cVar71;
      auVar4._0_14_ = auVar31 << 0x38;
      auVar29._4_8_ = 0;
      auVar29._0_4_ = uVar83;
      auVar8._12_3_ =
           (int3)(CONCAT26(auVar4._13_2_,
                           CONCAT15(cVar115 - ((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar81 -
                                              (0xff < uVar86)),uVar28)) >> 0x28);
      auVar8._0_12_ = auVar29 << 0x38;
      uVar83 = auVar8._11_4_;
      uVar30 = CONCAT44(uVar83,CONCAT13(cVar114 - ((uVar80 != 0) * (uVar80 < 0x100) * (char)uVar77 -
                                                  (0xff < uVar80)),uVar25));
      auVar11._10_5_ = (int5)((ulong)uVar30 >> 0x18);
      auVar11._0_10_ = (unkuint10)uVar59 << 0x38;
      uVar49 = CONCAT62(auVar11._9_6_,
                        CONCAT11(cVar110 - ((uVar76 != 0) * (uVar76 < 0x100) * bVar120 -
                                           (0xff < uVar76)),cVar71));
      auVar19._7_8_ = 0;
      auVar19._0_7_ = (uint7)((ulong)uVar49 >> 8);
      Var16 = CONCAT81(SUB158(auVar19 << 0x40,7),
                       cVar109 - ((uVar72 != 0) * (uVar72 < 0x100) * bVar116 - (0xff < uVar72)));
      auVar26._9_6_ = 0;
      auVar26._0_9_ = Var16;
      auVar20._1_10_ = SUB1510(auVar26 << 0x30,5);
      auVar20[0] = cVar105 - ((uVar70 != 0) * (uVar70 < 0x100) * bVar111 - (0xff < uVar70));
      auVar27._11_4_ = 0;
      auVar27._0_11_ = auVar20;
      auVar21._1_12_ = SUB1512(auVar27 << 0x20,3);
      auVar21[0] = cVar104 - ((uVar68 != 0) * (uVar68 < 0x100) * bVar106 - (0xff < uVar68));
      uVar59 = CONCAT11(0,bVar89 - ((uVar67 != 0) * (uVar67 < 0x100) * bVar90 - (0xff < uVar67)));
      auVar14._2_13_ = auVar21;
      auVar14._0_2_ = uVar59;
      auVar6._10_2_ = 0;
      auVar6._0_10_ = auVar14._0_10_;
      auVar6._12_2_ = (short)Var16;
      uVar32 = CONCAT42(auVar6._10_4_,auVar20._0_2_);
      auVar22._6_8_ = 0;
      auVar22._0_6_ = uVar32;
      fVar187 = (float)(int)((uint)uVar59 + iVar34);
      fVar191 = (float)((int)CONCAT82(SUB148(auVar22 << 0x40,6),auVar21._0_2_) + iVar34);
      fVar192 = (float)((int)uVar32 + iVar34);
      fVar193 = (float)(int)((auVar6._10_4_ >> 0x10) + iVar34);
      fVar60 = (float)(int)((uint)(ushort)((ulong)uVar49 >> 8) + iVar34);
      fVar69 = (float)(int)((uint)(ushort)((ulong)uVar30 >> 0x18) + iVar34);
      fVar73 = (float)(int)((uVar83 >> 8 & 0xffff) + iVar34);
      fVar82 = (float)(int)((uVar83 >> 0x18) + iVar34);
      uVar156 = (uint)fVar60 ^ (uint)DAT_001bcaf0;
      uVar161 = (uint)fVar69 ^ DAT_001bcaf0._4_4_;
      uVar162 = (uint)fVar73 ^ DAT_001bcaf0._8_4_;
      uVar163 = (uint)fVar82 ^ DAT_001bcaf0._12_4_;
      auVar133._0_4_ = -(uint)(-0x47800001 < (int)uVar156);
      auVar133._4_4_ = -(uint)(-0x47800001 < (int)uVar161);
      auVar133._8_4_ = -(uint)(-0x47800001 < (int)uVar162);
      auVar133._12_4_ = -(uint)(-0x47800001 < (int)uVar163);
      uVar177 = (uint)fVar187 ^ (uint)DAT_001bcaf0;
      uVar179 = (uint)fVar191 ^ DAT_001bcaf0._4_4_;
      uVar180 = (uint)fVar192 ^ DAT_001bcaf0._8_4_;
      uVar181 = (uint)fVar193 ^ DAT_001bcaf0._12_4_;
      auVar100._0_4_ = -(uint)(-0x47800001 < (int)uVar177);
      auVar100._4_4_ = -(uint)(-0x47800001 < (int)uVar179);
      auVar100._8_4_ = -(uint)(-0x47800001 < (int)uVar180);
      auVar100._12_4_ = -(uint)(-0x47800001 < (int)uVar181);
      auVar101 = packssdw(auVar100,auVar133);
      auVar134._0_4_ = -(uint)((int)uVar156 < -0x4cffffff);
      auVar134._4_4_ = -(uint)((int)uVar161 < -0x4cffffff);
      auVar134._8_4_ = -(uint)((int)uVar162 < -0x4cffffff);
      auVar134._12_4_ = -(uint)((int)uVar163 < -0x4cffffff);
      auVar61._0_4_ = -(uint)((int)uVar177 < -0x4cffffff);
      auVar61._4_4_ = -(uint)((int)uVar179 < -0x4cffffff);
      auVar61._8_4_ = -(uint)((int)uVar180 < -0x4cffffff);
      auVar61._12_4_ = -(uint)((int)uVar181 < -0x4cffffff);
      auVar170 = packssdw(auVar61,auVar134);
      auVar151._0_4_ = 0x7e - ((uint)fVar60 >> 0x17);
      auVar151._4_4_ = 0x7e - ((uint)fVar69 >> 0x17);
      auVar151._8_4_ = 0x7e - ((uint)fVar73 >> 0x17);
      auVar151._12_4_ = 0x7e - ((uint)fVar82 >> 0x17);
      auVar135._0_4_ = 0x7e - ((uint)fVar187 >> 0x17);
      auVar135._4_4_ = 0x7e - ((uint)fVar191 >> 0x17);
      auVar135._8_4_ = 0x7e - ((uint)fVar192 >> 0x17);
      auVar135._12_4_ = 0x7e - ((uint)fVar193 >> 0x17);
      auVar164._0_8_ = CONCAT44(fVar191,fVar187) & 0x7fffff007fffff;
      auVar164._8_4_ = (uint)fVar192 & 0x7fffff;
      auVar164._12_4_ = (uint)fVar193 & 0x7fffff;
      auVar185._0_8_ = CONCAT44(fVar69,fVar60) & 0x7fffff007fffff;
      auVar185._8_4_ = (uint)fVar73 & 0x7fffff;
      auVar185._12_4_ = (uint)fVar82 & 0x7fffff;
      auVar185 = auVar185 | _DAT_001c24b0;
      auVar164 = auVar164 | _DAT_001c24b0;
      auVar171._4_4_ = (int)(float)((((uint)fVar191 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
      auVar171._12_4_ = (int)(float)((((uint)fVar193 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
      uVar145 = auVar164._0_4_;
      uVar168 = auVar164._4_4_;
      uVar83 = auVar164._8_4_;
      uVar129 = auVar164._12_4_;
      uVar53 = auVar164._8_8_;
      uVar140 = uVar145 * (int)(float)((((uint)fVar187 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
      uVar144 = (uint)((uVar53 & 0xffffffff) *
                      (ulong)(uint)(int)(float)((((uint)fVar192 >> 0x17) - 0x5e) * 0x800000 +
                                               0x3f800000));
      auVar171._0_4_ = auVar171._4_4_;
      auVar171._8_4_ = auVar171._12_4_;
      uVar173 = (uint)((auVar171._8_8_ & 0xffffffff) * (ulong)uVar129);
      auVar146._4_4_ = (int)(float)((((uint)fVar69 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
      auVar146._12_4_ = (int)(float)((((uint)fVar82 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
      uVar169 = auVar185._0_4_ *
                (int)(float)((((uint)fVar60 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
      uVar174 = (uint)((auVar185._8_8_ & 0xffffffff) *
                      (ulong)(uint)(int)(float)((((uint)fVar73 >> 0x17) - 0x5e) * 0x800000 +
                                               0x3f800000));
      auVar146._0_4_ = auVar146._4_4_;
      auVar146._8_4_ = auVar146._12_4_;
      auVar147._0_4_ = auVar146._4_4_ * auVar185._4_4_;
      lVar150 = (auVar146._8_8_ & 0xffffffff) * (ulong)auVar185._12_4_;
      auVar147._8_4_ = (uint)lVar150;
      auVar147._12_4_ = (undefined4)((ulong)lVar150 >> 0x20);
      auVar147._4_4_ = auVar147._8_4_;
      auVar61 = pshuflw(auVar147,auVar135,0xfe);
      lVar150 = auVar61._0_8_;
      auVar172._0_4_ = uVar145 >> lVar150;
      auVar172._4_4_ = uVar168 >> lVar150;
      auVar172._8_4_ = uVar83 >> lVar150;
      auVar172._12_4_ = uVar129 >> lVar150;
      auVar61 = pshuflw(in_XMM14,auVar135,0x54);
      uVar145 = uVar145 >> auVar61._0_8_;
      auVar136._4_4_ = auVar135._12_4_;
      auVar136._0_4_ = auVar135._8_4_;
      auVar136._8_4_ = auVar135._8_4_;
      auVar136._12_4_ = auVar135._12_4_;
      auVar199 = pshuflw(auVar172,auVar136,0xfe);
      lVar150 = auVar199._0_8_;
      auVar2._4_8_ = uVar53;
      auVar2._0_4_ = uVar168 >> lVar150;
      auVar194._0_8_ = auVar2._0_8_ << 0x20;
      auVar194._8_4_ = uVar83 >> lVar150;
      auVar194._12_4_ = uVar129 >> lVar150;
      auVar61 = pshuflw(auVar136,auVar136,0x54);
      lVar150 = auVar61._0_8_;
      auVar3._4_8_ = uVar53;
      auVar3._0_4_ = uVar168 >> lVar150;
      auVar165._0_8_ = auVar3._0_8_ << 0x20;
      auVar165._8_4_ = uVar83 >> lVar150;
      auVar165._12_4_ = uVar129 >> lVar150;
      auVar166._8_8_ = auVar194._8_8_;
      auVar166._0_8_ = auVar165._8_8_;
      auVar61 = pshuflw(auVar61,auVar151,0xfe);
      uVar197 = auVar185._4_4_ >> auVar61._0_8_;
      auVar61 = pshuflw(auVar199,auVar151,0x54);
      uVar129 = auVar185._0_4_ >> auVar61._0_8_;
      auVar152._4_4_ = auVar151._12_4_;
      auVar152._0_4_ = auVar151._8_4_;
      auVar152._8_4_ = auVar151._8_4_;
      auVar152._12_4_ = auVar151._12_4_;
      auVar61 = pshuflw(auVar166,auVar152,0xfe);
      uVar83 = auVar185._12_4_ >> auVar61._0_8_;
      auVar195 = ~auVar170 & ~auVar101 & auVar200;
      auVar61 = pshuflw(auVar152,auVar152,0x54);
      uVar186 = auVar185._8_4_ >> auVar61._0_8_;
      auVar149._0_4_ = (int)(short)uVar129;
      auVar149._4_4_ = (int)(short)uVar197;
      auVar149._8_4_ = (int)(short)uVar186;
      auVar149._12_4_ = (int)(short)uVar83;
      auVar175._0_4_ = (int)(short)uVar145;
      auVar175._4_4_ = (int)(short)auVar172._4_4_;
      auVar175._8_4_ = (int)(short)auVar165._8_4_;
      auVar175._12_4_ = (int)(short)auVar194._12_4_;
      auVar176 = packssdw(auVar175,auVar149);
      auVar154._0_4_ = -(uint)(0 < (int)(uVar169 ^ 0x80000000));
      auVar154._4_4_ = -(uint)(0 < (int)(auVar147._0_4_ ^ 0x80000000));
      auVar154._8_4_ = -(uint)(0 < (int)(uVar174 ^ 0x80000000));
      auVar154._12_4_ = -(uint)(0 < (int)(auVar147._8_4_ ^ 0x80000000));
      auVar153._0_4_ = -(uint)(0 < (int)(uVar140 ^ 0x80000000));
      auVar153._4_4_ = -(uint)(0 < (int)(auVar171._4_4_ * uVar168 ^ 0x80000000));
      auVar153._8_4_ = -(uint)(0 < (int)(uVar144 ^ 0x80000000));
      auVar153._12_4_ = -(uint)(0 < (int)(uVar173 ^ 0x80000000));
      auVar199 = packssdw(auVar153,auVar154);
      auVar61 = ~auVar199 & auVar195;
      auVar142._0_4_ = -(uint)(-0x80000000 < (int)uVar140);
      auVar142._4_4_ = -(uint)(-0x80000000 < (int)(auVar171._4_4_ * uVar168));
      auVar142._8_4_ = -(uint)(-0x80000000 < (int)uVar144);
      auVar142._12_4_ = -(uint)(-0x80000000 < (int)uVar173);
      auVar182._0_4_ = -(uint)(-0x80000000 < (int)uVar169);
      auVar182._4_4_ = -(uint)(-0x80000000 < (int)auVar147._0_4_);
      auVar182._8_4_ = -(uint)(-0x80000000 < (int)uVar174);
      auVar182._12_4_ = -(uint)(-0x80000000 < (int)auVar147._8_4_);
      auVar148._0_4_ = -(uint)((uVar145 & (uint)DAT_001bc010) == 0);
      auVar148._4_4_ = -(uint)((auVar172._4_4_ & DAT_001bc010._4_4_) == 0);
      auVar148._8_4_ = -(uint)((auVar165._8_4_ & DAT_001bc010._8_4_) == 0);
      auVar148._12_4_ = -(uint)((auVar194._12_4_ & DAT_001bc010._12_4_) == 0);
      auVar137._0_4_ = -(uint)((uVar129 & (uint)DAT_001bc010) == 0);
      auVar137._4_4_ = -(uint)((uVar197 & DAT_001bc010._4_4_) == 0);
      auVar137._8_4_ = -(uint)((uVar186 & DAT_001bc010._8_4_) == 0);
      auVar137._12_4_ = -(uint)((uVar83 & DAT_001bc010._12_4_) == 0);
      auVar149 = packssdw(auVar148 | auVar142,auVar137 | auVar182);
      auVar154 = auVar199 & auVar195 | ~auVar149 & auVar61;
      auVar157._0_4_ = -(uint)(-0x800001 < (int)uVar156);
      auVar157._4_4_ = -(uint)(-0x800001 < (int)uVar161);
      auVar157._8_4_ = -(uint)(-0x800001 < (int)uVar162);
      auVar157._12_4_ = -(uint)(-0x800001 < (int)uVar163);
      auVar178._0_4_ = -(uint)(-0x800001 < (int)uVar177);
      auVar178._4_4_ = -(uint)(-0x800001 < (int)uVar179);
      auVar178._8_4_ = -(uint)(-0x800001 < (int)uVar180);
      auVar178._12_4_ = -(uint)(-0x800001 < (int)uVar181);
      auVar96 = packssdw(auVar178,auVar157);
      auVar159._0_4_ = -(uint)(0x477fefff < (int)fVar60);
      auVar159._4_4_ = -(uint)(0x477fefff < (int)fVar69);
      auVar159._8_4_ = -(uint)(0x477fefff < (int)fVar73);
      auVar159._12_4_ = -(uint)(0x477fefff < (int)fVar82);
      auVar201._0_4_ = -(uint)(0x477fefff < (int)fVar187);
      auVar201._4_4_ = -(uint)(0x477fefff < (int)fVar191);
      auVar201._8_4_ = -(uint)(0x477fefff < (int)fVar192);
      auVar201._12_4_ = -(uint)(0x477fefff < (int)fVar193);
      auVar202 = packssdw(auVar201,auVar159);
      auVar184._0_4_ = -(uint)((int)fVar60 < 0x477ff000);
      auVar184._4_4_ = -(uint)((int)fVar69 < 0x477ff000);
      auVar184._8_4_ = -(uint)((int)fVar73 < 0x477ff000);
      auVar184._12_4_ = -(uint)((int)fVar82 < 0x477ff000);
      auVar158._0_4_ = -(uint)((int)fVar187 < 0x477ff000);
      auVar158._4_4_ = -(uint)((int)fVar191 < 0x477ff000);
      auVar158._8_4_ = -(uint)((int)fVar192 < 0x477ff000);
      auVar158._12_4_ = -(uint)((int)fVar193 < 0x477ff000);
      auVar159 = packssdw(auVar158,auVar184);
      auVar138._0_4_ = (uint)fVar60 >> 0xd;
      auVar138._4_4_ = (uint)fVar69 >> 0xd;
      auVar138._8_4_ = (uint)fVar73 >> 0xd;
      auVar138._12_4_ = (uint)fVar82 >> 0xd;
      auVar143._0_4_ = (uint)fVar187 >> 0xd;
      auVar143._4_4_ = (uint)fVar191 >> 0xd;
      auVar143._8_4_ = (uint)fVar192 >> 0xd;
      auVar143._12_4_ = (uint)fVar193 >> 0xd;
      auVar199 = auVar143 & _DAT_001bc010;
      auVar195 = auVar138 & _DAT_001bc010;
      auVar196._0_4_ = ((int)fVar60 + 0x8000fff + auVar195._0_4_) * 8 >> 0x10;
      auVar196._4_4_ = ((int)fVar69 + 0x8000fff + auVar195._4_4_) * 8 >> 0x10;
      auVar196._8_4_ = ((int)fVar73 + 0x8000fff + auVar195._8_4_) * 8 >> 0x10;
      auVar196._12_4_ = ((int)fVar82 + 0x8000fff + auVar195._12_4_) * 8 >> 0x10;
      auVar183._0_4_ = ((int)fVar187 + 0x8000fff + auVar199._0_4_) * 8 >> 0x10;
      auVar183._4_4_ = ((int)fVar191 + 0x8000fff + auVar199._4_4_) * 8 >> 0x10;
      auVar183._8_4_ = ((int)fVar192 + 0x8000fff + auVar199._8_4_) * 8 >> 0x10;
      auVar183._12_4_ = ((int)fVar193 + 0x8000fff + auVar199._12_4_) * 8 >> 0x10;
      auVar184 = packssdw(auVar183,auVar196);
      in_XMM14 = ~auVar96 & auVar101 & auVar200;
      auVar96 = auVar96 & auVar101 & auVar200;
      auVar102._0_4_ = -(uint)(fVar60 == INFINITY);
      auVar102._4_4_ = -(uint)(fVar69 == INFINITY);
      auVar102._8_4_ = -(uint)(fVar73 == INFINITY);
      auVar102._12_4_ = -(uint)(fVar82 == INFINITY);
      auVar188._0_4_ = -(uint)(fVar187 == INFINITY);
      auVar188._4_4_ = -(uint)(fVar191 == INFINITY);
      auVar188._8_4_ = -(uint)(fVar192 == INFINITY);
      auVar188._12_4_ = -(uint)(fVar193 == INFINITY);
      auVar189 = packssdw(auVar188,auVar102);
      auVar143 = auVar143 & _DAT_001c2560;
      auVar138 = auVar138 & _DAT_001c2560;
      auVar195 = packssdw(auVar143,auVar138);
      auVar139._0_4_ = -(uint)(auVar138._0_4_ == 0);
      auVar139._4_4_ = -(uint)(auVar138._4_4_ == 0);
      auVar139._8_4_ = -(uint)(auVar138._8_4_ == 0);
      auVar139._12_4_ = -(uint)(auVar138._12_4_ == 0);
      auVar190._0_4_ = -(uint)(auVar143._0_4_ == 0);
      auVar190._4_4_ = -(uint)(auVar143._4_4_ == 0);
      auVar190._8_4_ = -(uint)(auVar143._8_4_ == 0);
      auVar190._12_4_ = -(uint)(auVar143._12_4_ == 0);
      auVar199 = packssdw(auVar190,auVar139);
      auVar62._0_2_ = auVar199._0_2_ >> 0xf;
      auVar62._2_2_ = auVar199._2_2_ >> 0xf;
      auVar62._4_2_ = auVar199._4_2_ >> 0xf;
      auVar62._6_2_ = auVar199._6_2_ >> 0xf;
      auVar62._8_2_ = auVar199._8_2_ >> 0xf;
      auVar62._10_2_ = auVar199._10_2_ >> 0xf;
      auVar62._12_2_ = auVar199._12_2_ >> 0xf;
      auVar62._14_2_ = auVar199._14_2_ >> 0xf;
      auVar149 = auVar149 & auVar61;
      auVar159 = auVar159 & in_XMM14;
      auVar170 = auVar170 & ~auVar101 & auVar200;
      auVar202 = auVar202 & in_XMM14;
      auVar190 = auVar189 & auVar96;
      auVar61 = ~auVar189 & auVar96 | auVar159 | auVar202 | auVar190 |
                ~auVar96 & (auVar149 | auVar170 | auVar154);
      auVar199 = psllw(auVar154,0xf);
      auVar199 = psraw(auVar199,0xf);
      auVar200._0_2_ = auVar176._0_2_ + 1;
      auVar200._2_2_ = auVar176._2_2_ + 1;
      auVar200._4_2_ = auVar176._4_2_ + 1;
      auVar200._6_2_ = auVar176._6_2_ + 1;
      auVar200._8_2_ = auVar176._8_2_ + 1;
      auVar200._10_2_ = auVar176._10_2_ + 1;
      auVar200._12_2_ = auVar176._12_2_ + 1;
      auVar200._14_2_ = auVar176._14_2_ + 1;
      auVar170 = auVar202 & _DAT_001c4af0 |
                 ~auVar202 &
                 (~auVar149 &
                  (~auVar199 &
                   ~auVar170 &
                   (auVar190 & _DAT_001c4af0 |
                   ~auVar190 &
                   (~auVar159 & (auVar195 | _DAT_001c4af0 | auVar62) | auVar184 & auVar159)) |
                  auVar200 & auVar199) | auVar176 & auVar149);
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)(pcVar50 + lVar51 * 2 + -0xe) = auVar170._0_2_;
      }
      if ((auVar61._0_4_ >> 0x10 & 1) != 0) {
        *(short *)(pcVar50 + lVar51 * 2 + -0xc) = auVar170._2_2_;
      }
      local_178 = auVar103._0_8_;
      lStack_170 = auVar103._8_8_;
      local_d8 = auVar155._0_8_;
      lStack_d0 = auVar155._8_8_;
      local_e8 = auVar160._0_8_;
      lStack_e0 = auVar160._8_8_;
      local_188 = auVar167._0_8_;
      lStack_180 = auVar167._8_8_;
      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(pcVar50 + lVar51 * 2 + -10) = auVar170._4_2_;
      }
      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(pcVar50 + lVar51 * 2 + -8) = auVar170._6_2_;
      }
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)(pcVar50 + lVar51 * 2 + -6) = auVar170._8_2_;
      }
      if ((auVar61 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(short *)(pcVar50 + lVar51 * 2 + -4) = auVar170._10_2_;
      }
      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(pcVar50 + lVar51 * 2 + -2) = auVar170._12_2_;
      }
      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(pcVar50 + lVar51 * 2) = auVar170._14_2_;
      }
      auVar103._0_8_ = local_178 + 8;
      auVar103._8_8_ = lStack_170 + 8;
      auVar155._0_8_ = local_d8 + 8;
      auVar155._8_8_ = lStack_d0 + 8;
      auVar160._0_8_ = local_e8 + 8;
      auVar160._8_8_ = lStack_e0 + 8;
      auVar167._0_8_ = local_188 + 8;
      auVar167._8_8_ = lStack_180 + 8;
      auVar170[0] = bVar89 + 8;
      auVar170[1] = cVar104 + '\b';
      auVar170[2] = cVar105 + '\b';
      auVar170[3] = cVar109 + '\b';
      auVar170[4] = cVar110 + '\b';
      auVar170[5] = cVar114 + '\b';
      auVar170[6] = cVar115 + '\b';
      auVar170[7] = cVar119 + '\b';
      auVar170[8] = bVar33;
      auVar170[9] = bVar74;
      auVar170[10] = bVar75;
      auVar170[0xb] = bVar78;
      auVar170[0xc] = bVar79;
      auVar170[0xd] = bVar84;
      auVar170[0xe] = bVar85;
      auVar170[0xf] = bVar88;
      lVar51 = lVar51 + 8;
    } while (lVar51 != 0x7f);
    uVar37 = uVar37 + 1;
    pcVar50 = pcVar50 + 0xea;
  } while (uVar37 != 0x61);
  bVar33 = IlmThread_3_2::supportsThreads();
  uVar83 = 0;
  do {
    cVar71 = IlmThread_3_2::supportsThreads();
    if (cVar71 != '\0') {
      Imf_3_2::setGlobalThreadCount(uVar83);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar34 = Imf_3_2::globalThreadCount();
      plVar38 = (long *)std::ostream::operator<<(&std::cout,iVar34);
      std::ios::widen((char)*(undefined8 *)(*plVar38 + -0x18) + (char)plVar38);
      std::ostream::put((char)plVar38);
      std::ostream::flush();
    }
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    pcVar1 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&filename,pcVar1,pcVar1 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&filename);
    iVar34 = 0;
    bVar58 = true;
    do {
      bVar57 = bVar58;
      __filename._M_p = filename._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"line order ",0xb);
      poVar39 = (ostream *)std::ostream::operator<<(&std::cout,iVar34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar39,":",1);
      std::ostream::flush();
      _out = 0;
      Imf_3_2::Header::Header(&hdr,0x75,0x61,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar40 = (int *)Imf_3_2::Header::lineOrder();
      *piVar40 = iVar34;
      pcVar50 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar50,(Channel *)0x1ca214);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice((Slice *)&out,HALF,pcVar36,2,0xea,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(__filename._M_p);
      iVar34 = Imf_3_2::globalThreadCount();
      Imf_3_2::OutputFile::OutputFile(&out,__filename._M_p,&hdr,iVar34);
      Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_2::OutputFile::writePixels((int)(Channel *)&out);
      Imf_3_2::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar34 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile(&in,__filename._M_p,iVar34);
      Imf_3_2::InputFile::header();
      piVar40 = (int *)Imf_3_2::Header::dataWindow();
      iVar34 = *piVar40;
      lVar150 = (long)piVar40[2] - (long)iVar34;
      uVar37 = lVar150 + 1;
      iVar56 = piVar40[1];
      iVar35 = piVar40[3] - iVar56;
      uVar129 = iVar35 + 1;
      lVar51 = (long)(int)uVar129 * uVar37;
      uVar53 = lVar51 * 2;
      if (lVar51 < 0) {
        uVar53 = 0xffffffffffffffff;
      }
      pvVar41 = operator_new__(uVar53);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar49 = 2;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,
                 (char *)((long)pvVar41 + (long)iVar34 * -2 + (long)-iVar56 * uVar37 * 2),2,
                 uVar37 * 2,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
      Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&in);
      iVar34 = piVar40[3];
      iVar56 = 0;
      do {
        for (iVar55 = piVar40[1] + iVar56; uVar92 = (undefined4)uVar49, iVar55 <= iVar34;
            iVar55 = iVar55 + 7) {
          Imf_3_2::InputFile::readPixels((int)&in);
          iVar34 = piVar40[3];
        }
        iVar56 = iVar56 + 1;
      } while (iVar56 != 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_2::InputFile::header();
      puVar42 = (undefined8 *)Imf_3_2::Header::displayWindow();
      puVar43 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar34 = -(uint)((int)*puVar43 == (int)*puVar42);
      iVar56 = -(uint)((int)((ulong)*puVar43 >> 0x20) == (int)((ulong)*puVar42 >> 0x20));
      auVar63._4_4_ = iVar34;
      auVar63._0_4_ = iVar34;
      auVar63._8_4_ = iVar56;
      auVar63._12_4_ = iVar56;
      iVar34 = movmskpd(uVar92,auVar63);
      if ((iVar34 != 3) ||
         (iVar56 = -(uint)((int)puVar43[1] == (int)puVar42[1]),
         iVar55 = -(uint)((int)((ulong)puVar43[1] >> 0x20) == (int)((ulong)puVar42[1] >> 0x20)),
         auVar64._4_4_ = iVar56, auVar64._0_4_ = iVar56, auVar64._8_4_ = iVar55,
         auVar64._12_4_ = iVar55, iVar56 = movmskpd((int)puVar43,auVar64), iVar56 != 3)) {
        __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x81,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      puVar42 = (undefined8 *)Imf_3_2::Header::dataWindow();
      puVar43 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar56 = -(uint)((int)*puVar43 == (int)*puVar42);
      iVar55 = -(uint)((int)((ulong)*puVar43 >> 0x20) == (int)((ulong)*puVar42 >> 0x20));
      auVar65._4_4_ = iVar56;
      auVar65._0_4_ = iVar56;
      auVar65._8_4_ = iVar55;
      auVar65._12_4_ = iVar55;
      iVar34 = movmskpd(iVar34,auVar65);
      if ((iVar34 != 3) ||
         (iVar34 = -(uint)((int)puVar43[1] == (int)puVar42[1]),
         iVar56 = -(uint)((int)((ulong)puVar43[1] >> 0x20) == (int)((ulong)puVar42[1] >> 0x20)),
         auVar66._4_4_ = iVar34, auVar66._0_4_ = iVar34, auVar66._8_4_ = iVar56,
         auVar66._12_4_ = iVar56, iVar34 = movmskpd((int)puVar43,auVar66), iVar34 != 3)) {
        __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x82,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar44 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar60 = *pfVar44;
      pfVar44 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar60 != *pfVar44) || (NAN(fVar60) || NAN(*pfVar44))) {
        __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x83,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar44 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar45 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar44 != *pfVar45) || (NAN(*pfVar44) || NAN(*pfVar45))) ||
          (pfVar44[1] != pfVar45[1])) || (NAN(pfVar44[1]) || NAN(pfVar45[1]))) {
        __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x85,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar44 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar60 = *pfVar44;
      pfVar44 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar60 != *pfVar44) || (NAN(fVar60) || NAN(*pfVar44))) {
        __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x86,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      piVar40 = (int *)Imf_3_2::Header::lineOrder();
      iVar34 = *piVar40;
      piVar40 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar34 != *piVar40) {
        __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x87,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      piVar40 = (int *)Imf_3_2::Header::compression();
      iVar34 = *piVar40;
      piVar40 = (int *)Imf_3_2::Header::compression();
      if (iVar34 != *piVar40) {
        __assert_fail("in.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x88,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::Header::channels();
      p_Var46 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      Imf_3_2::InputFile::header();
      Imf_3_2::Header::channels();
      p_Var47 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      while( true ) {
        Imf_3_2::Header::channels();
        p_Var48 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
        if (p_Var46 == p_Var48) break;
        iVar34 = strcmp((char *)(p_Var46 + 1),(char *)(p_Var47 + 1));
        if (iVar34 != 0) {
          __assert_fail("!strcmp (hi.name (), ii.name ())",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x8f,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (p_Var46[9]._M_color != p_Var47[9]._M_color) {
          __assert_fail("hi.channel ().type == ii.channel ().type",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x90,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (*(int *)&p_Var46[9].field_0x4 != *(int *)&p_Var47[9].field_0x4) {
          __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x91,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (*(int *)&p_Var46[9]._M_parent != *(int *)&p_Var47[9]._M_parent) {
          __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x92,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        p_Var46 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var46);
        p_Var47 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var47);
      }
      Imf_3_2::InputFile::header();
      Imf_3_2::Header::channels();
      p_Var46 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var47 != p_Var46) {
        __assert_fail("ii == in.header ().channels ().end ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x98,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      if (-1 < iVar35) {
        uVar53 = 0;
        pcVar50 = pcVar36;
        pvVar52 = pvVar41;
        do {
          if (-1 < (int)lVar150) {
            uVar54 = 0;
            do {
              fVar60 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(pcVar50 + uVar54 * 2) * 4);
              pfVar44 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)((long)pvVar52 + uVar54 * 2) * 4);
              if ((fVar60 != *pfVar44) || (NAN(fVar60) || NAN(*pfVar44))) {
                __assert_fail("ph1[y][x] == ph2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                              ,0x9c,
                              "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                             );
              }
              uVar54 = uVar54 + 1;
            } while ((uVar37 & 0xffffffff) != uVar54);
          }
          uVar53 = uVar53 + 1;
          pvVar52 = (void *)((long)pvVar52 + uVar37 * 2);
          pcVar50 = pcVar50 + 0xea;
        } while (uVar53 != uVar129);
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      operator_delete__(pvVar41);
      Imf_3_2::InputFile::~InputFile(&in);
      remove(__filename._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      Imf_3_2::Header::~Header(&hdr);
      iVar34 = 1;
      bVar58 = false;
    } while (bVar57);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p != &filename.field_2) {
      operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
    }
    bVar58 = uVar83 < 3;
    uVar83 = uVar83 + 1;
    if ((bVar33 & bVar58) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      operator_delete__(pcVar36);
      return;
    }
  } while( true );
}

Assistant:

void
testLineOrder (const std::string& tempDir)
{
    try
    {
        cout << "Testing line order and random access to scan lines" << endl;

        const int W = 117;
        const int H = 97;

        Array2D<half> ph (H, W);
        fillPixels (ph, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            std::string filename = tempDir + "imf_test_lorder.exr";

            for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
            {
                writeRead (ph, filename.c_str (), W, H, LineOrder (lorder));
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}